

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O2

int CheckOpponent(Situation *situation)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  
  iVar3 = situation->current_player;
  iVar6 = iVar3 * 0x10;
  bVar1 = situation->current_pieces[iVar3 * -0x10 + 0x20];
  uVar7 = (uint)(bVar1 >> 4);
  uVar8 = bVar1 & 0xf;
  iVar5 = iVar6 + 0x15;
  lVar10 = (long)iVar6;
  for (lVar11 = lVar10; lVar11 + 0x15 <= (long)(iVar6 + 0x16); lVar11 = lVar11 + 1) {
    bVar2 = situation->current_pieces[lVar11 + 0x15];
    if (bVar2 != 0) {
      if ((HORSE_LEGAL_MOVE[(bVar1 + 0x100) - (uint)bVar2] != 0) &&
         (situation->current_board
          [(int)(HORSE_LEGAL_MOVE[(bVar1 + 0x100) - (uint)bVar2] + (uint)bVar2)] == '\0')) {
        return iVar5;
      }
    }
    iVar5 = iVar5 + 1;
  }
  uVar9 = (ulong)(uint)bVar1;
  iVar5 = iVar6 + 0x17;
  for (lVar11 = lVar10; lVar11 + 0x17 <= (long)(iVar6 + 0x18); lVar11 = lVar11 + 1) {
    bVar2 = situation->current_pieces[lVar11 + 0x17];
    if (bVar2 != 0) {
      if ((bVar2 & 0xf) == uVar8) {
        uVar4 = *(ushort *)
                 ((ulong)(bVar2 >> 4) * 0x2000 + 0x327d42 + (ulong)situation->bit_col[uVar8] * 8) &
                BIT_COL_MASK[uVar9];
      }
      else {
        if (bVar2 >> 4 != uVar7) goto LAB_00108d02;
        uVar4 = *(ushort *)
                 ((ulong)((bVar2 & 0xf) << 0xc) + 0x321d42 + (ulong)situation->bit_row[uVar7] * 8) &
                BIT_ROW_MASK[uVar9];
      }
      if (uVar4 != 0) {
        return iVar5;
      }
    }
LAB_00108d02:
    iVar5 = iVar5 + 1;
  }
  iVar5 = iVar6 + 0x19;
  do {
    if ((long)(iVar6 + 0x1a) < lVar10 + 0x19) {
      uVar7 = (uint)situation->current_board[(int)((uint)bVar1 + iVar3 * -0x20 + 0x10)];
      if ((iVar6 + 0x10U & uVar7) == 0 || (uVar7 & 0xf) < 0xb) {
        lVar11 = uVar9 - 1;
        do {
          if ((long)((ulong)bVar1 + 1) < lVar11) {
            return 0;
          }
          uVar7 = (uint)situation->current_board[lVar11];
          lVar11 = lVar11 + 2;
        } while ((uVar7 & 0xf) < 0xb || (iVar6 + 0x10U & uVar7) == 0);
      }
      return uVar7;
    }
    bVar2 = situation->current_pieces[lVar10 + 0x19];
    if (bVar2 != 0) {
      if ((bVar2 & 0xf) == uVar8) {
        uVar4 = *(ushort *)
                 ((ulong)(bVar2 >> 4) * 0x2000 + 0x327d44 + (ulong)situation->bit_col[uVar8] * 8) &
                BIT_COL_MASK[uVar9];
      }
      else {
        if (bVar2 >> 4 != uVar7) goto LAB_00108d96;
        uVar4 = *(ushort *)
                 ((ulong)((bVar2 & 0xf) << 0xc) + 0x321d44 + (ulong)situation->bit_row[uVar7] * 8) &
                BIT_ROW_MASK[uVar9];
      }
      if (uVar4 != 0) {
        return iVar5;
      }
    }
LAB_00108d96:
    iVar5 = iVar5 + 1;
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

int CheckOpponent(const Situation & situation){
    // 1. 获得玩家特征值
    int player_flag = GetPlayerFlag(situation.current_player), player = situation.current_player;
    int from, to, from_row, from_col, to_row, to_col;

    // 1. 判断对方将(帅)是否在棋盘上，并记录其位置
    to = situation.current_pieces[GetPlayerFlag(OpponentPlayer(situation.current_player)) + 0];
    // if(to == 0) return 1;
    to_row = GetRow(to);
    to_col = GetCol(to);

    // 2. 检测马的将军
    for(int i = player_flag + 5; i <= player_flag + 6; i ++){
        from = situation.current_pieces[i];
        if(from != 0){
            int horse_leg = HORSE_LEGAL_MOVE[to - from + 256] + from;
            if(horse_leg != from && situation.current_board[horse_leg] == 0) return i;
        }
    }

    // 3. 检测车的将军
    for(int i = player_flag + 7; i <= player_flag + 8; i ++){
        from = situation.current_pieces[i];
        if(from != 0){
            from_row = GetRow(from);
            from_col = GetCol(from);
            if(from_col == to_col){
                if((ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].rook_capture & BIT_COL_MASK[to]) != 0) 
                    return i;
            }
            else if(from_row == to_row){
                if((ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].rook_capture & BIT_ROW_MASK[to]) != 0) 
                    return i;
            }
        }
    }
    
    // 4. 检测炮的将军
    for(int i = player_flag + 9; i <= player_flag + 10; i ++){
        from = situation.current_pieces[i];
        if(from != 0){
            from_row = GetRow(from);
            from_col = GetCol(from);
            if(from_col == to_col){
                if((ROOK_CANNON_CAN_GET_COL_MASK[from_row - 3][situation.bit_col[from_col]].cannon_capture & BIT_COL_MASK[to]) != 0) 
                    return i;
            }
            else if(from_row == to_row){
                if((ROOK_CANNON_CAN_GET_ROW_MASK[from_col - 3][situation.bit_row[from_row]].cannon_capture & BIT_ROW_MASK[to]) != 0) 
                    return i;
            }
        }
    }

    // 5. 检测兵(卒)的将军(纵向)
    from = SquareBack(to, player);
    int from_id = situation.current_board[from];
    if(((from_id & player_flag) != 0) && ((from_id & 15) >= 11))
        return from_id;

    // 6. 检测兵(卒)的将军(横向)
    for(from = to - 1; from <= to + 1; from += 2){
        int from_id = situation.current_board[from];
        if(((from_id & player_flag) != 0) && ((from_id & 15) >= 11))
            return from_id;
    }

    // 7. 没有被将军
    return 0;
}